

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O3

void int_linear_dom(vec<int> *a,vec<IntVar_*> *x,int c)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  IntVar *pIVar5;
  IntVar **ppIVar6;
  IntVar *pIVar7;
  ulong uVar8;
  vec<vec<int>_> t;
  int local_50;
  int local_4c;
  vec<vec<int>_> local_48;
  int local_34;
  
  if (x->sz != 0) {
    uVar8 = 0;
    do {
      IntVar::specialiseToEL(x->data[uVar8]);
      uVar8 = uVar8 + 1;
    } while (uVar8 < x->sz);
  }
  local_48.sz = 0;
  local_48.cap = 0;
  local_48.data = (vec<int> *)0x0;
  ppIVar6 = x->data;
  pIVar5 = *ppIVar6;
  iVar3 = (pIVar5->min).v;
  local_50 = iVar3;
  if (iVar3 <= (pIVar5->max).v) {
    do {
      local_50 = iVar3;
      if (((pIVar5->min).v <= iVar3) &&
         ((pIVar5->vals == (Tchar *)0x0 || (pIVar5->vals[iVar3].v != '\0')))) {
        pIVar7 = ppIVar6[1];
        iVar4 = (pIVar7->min).v;
        local_4c = iVar4;
        if (iVar4 <= (pIVar7->max).v) {
          do {
            local_4c = iVar4;
            if (((pIVar7->min).v <= iVar4) &&
               ((pIVar7->vals == (Tchar *)0x0 || (pIVar7->vals[iVar4].v != '\0')))) {
              piVar1 = a->data;
              iVar3 = piVar1[1] * iVar4 + (c - local_50 * *piVar1);
              iVar4 = iVar3 / piVar1[2];
              if (iVar3 % piVar1[2] == 0) {
                pIVar5 = ppIVar6[2];
                local_34 = iVar4;
                if ((((pIVar5->min).v <= iVar4) && (iVar4 <= (pIVar5->max).v)) &&
                   ((pIVar5->vals == (Tchar *)0x0 || (pIVar5->vals[iVar4].v != '\0')))) {
                  vec<vec<int>_>::push(&local_48);
                  vec<int>::push(local_48.data + (local_48.sz - 1),&local_50);
                  vec<int>::push(local_48.data + (local_48.sz - 1),&local_4c);
                  vec<int>::push(local_48.data + (local_48.sz - 1),&local_34);
                  ppIVar6 = x->data;
                }
              }
            }
            iVar4 = local_4c + 1;
            pIVar7 = ppIVar6[1];
          } while (local_4c < (pIVar7->max).v);
          pIVar5 = *ppIVar6;
          local_4c = iVar4;
        }
      }
      iVar3 = local_50 + 1;
      bVar2 = local_50 < (pIVar5->max).v;
      local_50 = iVar3;
    } while (bVar2);
  }
  table_GAC(x,&local_48);
  vec<vec<int>_>::~vec(&local_48);
  return;
}

Assistant:

void int_linear_dom(vec<int>& a, vec<IntVar*>& x, int c) {
	assert(a.size() == 3 && x.size() == 3);

	for (unsigned int i = 0; i < x.size(); i++) {
		x[i]->specialiseToEL();
	}

	vec<vec<int> > t;
	for (int i = x[0]->getMin(); i <= x[0]->getMax(); i++) {
		if (!x[0]->indomain(i)) {
			continue;
		}
		for (int j = x[1]->getMin(); j <= x[1]->getMax(); j++) {
			if (!x[1]->indomain(j)) {
				continue;
			}
			int k = c - a[0] * i + a[1] * j;
			if (k % a[2] != 0) {
				continue;
			}
			k /= a[2];
			if (!x[2]->indomain(k)) {
				continue;
			}
			t.push();
			t.last().push(i);
			t.last().push(j);
			t.last().push(k);
		}
	}

	table_GAC(x, t);
}